

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ay_Emu.cpp
# Opt level: O2

blargg_err_t parse_header(byte_ *in,long size,file_t *out)

{
  byte_ *pbVar1;
  char *pcVar2;
  
  out->header = (header_t *)in;
  out->end = in + size;
  if ((0x13 < size) && (*(long *)in == 0x4c554d455941585a)) {
    pbVar1 = get_data(out,in + 0x12,(uint)in[0x10] * 4 + 4);
    out->tracks = pbVar1;
    pcVar2 = (blargg_err_t)0x0;
    if (pbVar1 == (byte_ *)0x0) {
      pcVar2 = "Missing track data";
    }
    return pcVar2;
  }
  return "Wrong file type for this emulator";
}

Assistant:

static blargg_err_t parse_header( byte const* in, long size, Ay_Emu::file_t* out )
{
	typedef Ay_Emu::header_t header_t;
	out->header = (header_t const*) in;
	out->end    = in + size;
	
	if ( size < Ay_Emu::header_size )
		return gme_wrong_file_type;
	
	header_t const& h = *(header_t const*) in;
	if ( memcmp( h.tag, "ZXAYEMUL", 8 ) )
		return gme_wrong_file_type;
	
	out->tracks = get_data( *out, h.track_info, (h.max_track + 1) * 4 );
	if ( !out->tracks )
		return "Missing track data";
	
	return 0;
}